

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_xmi_midiout.cpp
# Opt level: O3

DWORD * __thiscall
XMISong::MakeEvents(XMISong *this,DWORD *events,DWORD *max_event_p,DWORD max_time)

{
  DWORD time;
  TrackInfo *pTVar1;
  AutoNoteOff *pAVar2;
  uint uVar3;
  uint uVar4;
  EventSource due;
  DWORD delay;
  DWORD *events_00;
  bool bVar5;
  bool sysex_noroom;
  bool local_41;
  DWORD local_40;
  uint local_3c;
  DWORD *local_38;
  
  if (events < max_event_p && this->EventDue != EVENT_None) {
    pTVar1 = this->CurrSong;
    bVar5 = this->EventDue == EVENT_Real;
    local_3c = 0;
    delay = 0;
    local_40 = max_time;
    local_38 = events;
    do {
      if (bVar5) {
        pAVar2 = (AutoNoteOff *)&pTVar1->Delay;
      }
      else {
        pAVar2 = (this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Array;
      }
      time = pAVar2->Delay;
      delay = delay + time;
      local_3c = local_3c +
                 ((this->super_MIDIStreamer).Tempo * time) /
                 (uint)(this->super_MIDIStreamer).Division;
      AdvanceSong(this,time);
      due = this->EventDue;
      events_00 = events;
      do {
        local_41 = false;
        events = SendCommand(this,events_00,due,delay,(long)max_event_p - (long)events_00 >> 2,
                             &local_41);
        if (local_41 == true) {
          return events_00;
        }
        pTVar1 = this->CurrSong;
        if (pTVar1->Finished == true) {
          uVar3 = 0xffffffff;
          if ((this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Count == 0) {
            this->EventDue = EVENT_None;
            return events;
          }
LAB_0033d363:
          uVar4 = ((this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Array)->Delay;
        }
        else {
          uVar3 = pTVar1->Delay;
          if ((this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Count != 0) goto LAB_0033d363;
          uVar4 = 0xffffffff;
        }
        if (events != events_00) {
          delay = 0;
        }
        bVar5 = uVar3 < uVar4;
        if (uVar3 < uVar4) {
          pAVar2 = (AutoNoteOff *)&pTVar1->Delay;
        }
        else {
          pAVar2 = (this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Array;
        }
        due = EVENT_Fake - bVar5;
        this->EventDue = due;
      } while ((events < max_event_p) && (events_00 = events, pAVar2->Delay == 0));
    } while ((events == local_38) || ((events < max_event_p && (delay = 0, local_3c <= local_40))));
  }
  return events;
}

Assistant:

DWORD *XMISong::MakeEvents(DWORD *events, DWORD *max_event_p, DWORD max_time)
{
	DWORD *start_events;
	DWORD tot_time = 0;
	DWORD time = 0;
	DWORD delay;

	start_events = events;
	while (EventDue != EVENT_None && events < max_event_p && tot_time <= max_time)
	{
		// It's possible that this tick may be nothing but meta-events and
		// not generate any real events. Repeat this until we actually
		// get some output so we don't send an empty buffer to the MIDI
		// device.
		do
		{
			delay = GET_DELAY;
			time += delay;
			// Advance time for all tracks by the amount needed for the one up next.
			tot_time += delay * Tempo / Division;
			AdvanceSong(delay);
			// Play all events for this tick.
			do
			{
				bool sysex_noroom = false;
				DWORD *new_events = SendCommand(events, EventDue, time, max_event_p - events, sysex_noroom);
				if (sysex_noroom)
				{
					return events;
				}
				EventDue = FindNextDue();
				if (new_events != events)
				{
					time = 0;
				}
				events = new_events;
			}
			while (EventDue != EVENT_None && GET_DELAY == 0 && events < max_event_p);
		}
		while (start_events == events && EventDue != EVENT_None);
		time = 0;
	}
	return events;
}